

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::BuiltInResource,_8UL>::reserve
          (SmallVector<diligent_spirv_cross::BuiltInResource,_8UL> *this,size_t count)

{
  BuiltInResource *pBVar1;
  size_t sVar2;
  unsigned_long uVar3;
  unsigned_long *puVar4;
  BuiltInResource *pBVar5;
  BuiltInResource *local_58;
  ulong local_38;
  size_t i;
  BuiltInResource *new_buffer;
  unsigned_long local_20;
  size_t target_capacity;
  size_t count_local;
  SmallVector<diligent_spirv_cross::BuiltInResource,_8UL> *this_local;
  
  target_capacity = count;
  count_local = (size_t)this;
  uVar3 = ::std::numeric_limits<unsigned_long>::max();
  sVar2 = target_capacity;
  if ((uVar3 / 0x38 < count) ||
     (uVar3 = ::std::numeric_limits<unsigned_long>::max(), uVar3 >> 1 < sVar2)) {
    ::std::terminate();
  }
  if (this->buffer_capacity < target_capacity) {
    local_20 = this->buffer_capacity;
    if (local_20 == 0) {
      local_20 = 1;
    }
    new_buffer = (BuiltInResource *)0x8;
    puVar4 = ::std::max<unsigned_long>(&local_20,(unsigned_long *)&new_buffer);
    for (local_20 = *puVar4; local_20 < target_capacity; local_20 = local_20 << 1) {
    }
    if (local_20 < 9) {
      local_58 = AlignedBuffer<diligent_spirv_cross::BuiltInResource,_8UL>::data
                           (&this->stack_storage);
    }
    else {
      local_58 = (BuiltInResource *)malloc(local_20 * 0x38);
    }
    if (local_58 == (BuiltInResource *)0x0) {
      ::std::terminate();
    }
    if (local_58 != (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).ptr) {
      for (local_38 = 0;
          local_38 < (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).buffer_size;
          local_38 = local_38 + 1) {
        BuiltInResource::BuiltInResource
                  (local_58 + local_38,
                   (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).ptr + local_38);
        BuiltInResource::~BuiltInResource
                  ((this->super_VectorView<diligent_spirv_cross::BuiltInResource>).ptr + local_38);
      }
    }
    pBVar1 = (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).ptr;
    pBVar5 = AlignedBuffer<diligent_spirv_cross::BuiltInResource,_8UL>::data(&this->stack_storage);
    if (pBVar1 != pBVar5) {
      free((this->super_VectorView<diligent_spirv_cross::BuiltInResource>).ptr);
    }
    (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).ptr = local_58;
    this->buffer_capacity = local_20;
  }
  return;
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}